

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

void __thiscall
ot::commissioner::coap::Coap::RequestsCache::Eliminate
          (RequestsCache *this,RequestHolder *aRequestHolder)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  const_iterator __position;
  
  __position._M_node = (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->mContainer)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    peVar2 = (aRequestHolder->mRequest).
             super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    do {
      if (*(element_type **)(__position._M_node + 1) == peVar2) {
        std::
        _Rb_tree<ot::commissioner::coap::Coap::RequestHolder,_ot::commissioner::coap::Coap::RequestHolder,_std::_Identity<ot::commissioner::coap::Coap::RequestHolder>,_std::less<ot::commissioner::coap::Coap::RequestHolder>,_std::allocator<ot::commissioner::coap::Coap::RequestHolder>_>
        ::_M_erase_aux(&(this->mContainer)._M_t,__position);
        break;
      }
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
  }
  UpdateTimer(this);
  return;
}

Assistant:

void Coap::RequestsCache::Eliminate(const RequestHolder &aRequestHolder)
{
    for (auto holder = mContainer.begin(); holder != mContainer.end(); ++holder)
    {
        if (holder->mRequest == aRequestHolder.mRequest)
        {
            mContainer.erase(holder);
            break;
        }
    }

    UpdateTimer();
}